

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  ulong uVar1;
  char local_38;
  uint64 tmp;
  uint i;
  uint radix_local;
  uint64 number_local;
  MinimalFormatter *this_local;
  
  tmp._0_4_ = 0;
  _i = number;
  do {
    if (this->end_ <= this->cursor_ + (uint)tmp) break;
    uVar1 = _i % (ulong)radix;
    _i = _i / radix;
    local_38 = (char)uVar1;
    if (uVar1 < 10) {
      local_38 = local_38 + '0';
    }
    else {
      local_38 = local_38 + 'W';
    }
    this->cursor_[(uint)tmp] = local_38;
    tmp._0_4_ = (uint)tmp + 1;
  } while (_i != 0);
  std::reverse<char*>(this->cursor_,this->cursor_ + (uint)tmp);
  this->cursor_ = this->cursor_ + (uint)tmp;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }